

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

qreal differentialForProgress(QEasingCurve *curve,qreal pos)

{
  QDebug *pQVar1;
  long in_FS_OFFSET;
  double dVar2;
  double dVar3;
  QDebug local_38;
  QDebug local_30;
  undefined1 local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  dVar2 = (double)QEasingCurve::valueForProgress
                            ((double)(-(ulong)(0.5 <= pos) & (ulong)pos |
                                     ~-(ulong)(0.5 <= pos) & (ulong)(pos + 0.01)));
  dVar3 = (double)QEasingCurve::valueForProgress
                            ((double)(~-(ulong)(pos < 0.5) & (ulong)(pos + -0.01) |
                                     -(ulong)(pos < 0.5) & (ulong)pos));
  dVar2 = (dVar2 - dVar3) / 0.01;
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    pQVar1 = QDebug::operator<<(&local_38,"differentialForProgress(type: ");
    local_30.stream = pQVar1->stream;
    *(int *)(local_30.stream + 0x28) = *(int *)(local_30.stream + 0x28) + 1;
    QEasingCurve::type();
    operator<<((Stream *)local_28,(Type)&local_30);
    pQVar1 = QDebug::operator<<((QDebug *)local_28,", pos: ");
    pQVar1 = QDebug::operator<<(pQVar1,pos);
    pQVar1 = QDebug::operator<<(pQVar1,") = ");
    QDebug::operator<<(pQVar1,dVar2);
    QDebug::~QDebug((QDebug *)local_28);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return dVar2;
  }
  __stack_chk_fail();
}

Assistant:

static qreal differentialForProgress(const QEasingCurve &curve, qreal pos)
{
    const qreal dx = 0.01;
    qreal left = (pos < qreal(0.5)) ? pos : pos - qreal(dx);
    qreal right = (pos >= qreal(0.5)) ? pos : pos + qreal(dx);
    qreal d = (curve.valueForProgress(right) - curve.valueForProgress(left)) / qreal(dx);

    qCDebug(lcScroller) << "differentialForProgress(type: " << curve.type()
                        << ", pos: " << pos << ") = " << d;

    return d;
}